

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_etc.cpp
# Opt level: O2

void crnlib::pack_etc1_block_init(void)

{
  uint uVar1;
  ushort uVar2;
  long lVar4;
  uint uVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint diff;
  ulong uVar10;
  uint uVar11;
  uint packed_c;
  uint uVar12;
  int color;
  ulong uVar13;
  bool bVar14;
  uint uVar3;
  
  uVar10 = 0;
  do {
    if (uVar10 == 2) {
      return;
    }
    for (lVar4 = 0; lVar4 != 8; lVar4 = lVar4 + 1) {
      for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
        for (uVar13 = 0; uVar13 != 0x100; uVar13 = uVar13 + 1) {
          uVar11 = 0;
          uVar9 = 0;
          uVar8 = 0xffffffff;
          uVar3 = 0;
          uVar12 = 0;
          do {
            uVar2 = (ushort)uVar3;
            if ((uint)(uVar10 != 0) * 0x10 + 0x10 == uVar12) break;
            if (uVar10 == 0) {
              uVar7 = uVar9 | uVar12;
            }
            else {
              uVar7 = uVar12 >> 2 | uVar11;
            }
            uVar7 = uVar7 + (&g_etc1_inten_tables)[lVar4 * 4 + lVar6];
            if (0xfe < (int)uVar7) {
              uVar7 = 0xff;
            }
            if ((int)uVar7 < 1) {
              uVar7 = 0;
            }
            uVar5 = uVar7 - (int)uVar13;
            uVar1 = -uVar5;
            if (0 < (int)uVar5) {
              uVar1 = uVar5;
            }
            bVar14 = uVar8 <= uVar1;
            if (!bVar14) {
              uVar8 = uVar1;
              uVar3 = uVar12;
            }
            uVar2 = (ushort)uVar3;
            uVar12 = uVar12 + 1;
            uVar9 = uVar9 + 0x10;
            uVar11 = uVar11 + 8;
          } while (bVar14 || uVar13 != uVar7);
          *(ushort *)
           (g_etc1_inverse_lookup + uVar13 * 2 + (lVar6 << 4 | lVar4 * 2 | uVar10) * 0x200) =
               (ushort)(uVar8 << 8) | uVar2;
        }
      }
    }
    uVar10 = uVar10 + 1;
  } while( true );
}

Assistant:

void pack_etc1_block_init()
    {
        for (uint diff = 0; diff < 2; diff++)
        {
            const uint limit = diff ? 32 : 16;

            for (uint inten = 0; inten < 8; inten++)
            {
                for (uint selector = 0; selector < 4; selector++)
                {
                    const uint inverse_table_index = diff + (inten << 1) + (selector << 4);
                    for (int color = 0; color < 256; color++)
                    {
                        uint best_error = cUINT32_MAX, best_packed_c = 0;
                        for (uint packed_c = 0; packed_c < limit; packed_c++)
                        {
                            int v = etc1_decode_value(diff, inten, selector, packed_c);
                            uint err = labs(v - color);
                            if (err < best_error)
                            {
                                best_error = err;
                                best_packed_c = packed_c;
                                if (!best_error)
                                {
                                    break;
                                }
                            }
                        }
                        CRNLIB_ASSERT(best_error <= 255);
                        g_etc1_inverse_lookup[inverse_table_index][color] = static_cast<uint16>(best_packed_c | (best_error << 8));
                    }
                }
            }
        }
    }